

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::TestClearNamedBufferData<unsigned_short,false>
          (ClearTest *this,GLenum internalformat,GLsizei count,GLenum format,GLenum type,
          unsigned_short *data)

{
  GLuint GVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_short *data_00;
  undefined4 in_register_00000014;
  ulong uVar6;
  bool bVar7;
  GLuint buffer;
  GLuint local_48;
  GLenum local_44;
  ulong local_40;
  GLenum local_34;
  long lVar5;
  
  local_40 = CONCAT44(in_register_00000014,count);
  local_44 = internalformat;
  local_34 = type;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_48 = 0;
  (**(code **)(lVar5 + 0x3b8))(1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x374);
  (*this->m_pNamedBufferData)(local_48,(int)local_40 * 2,(GLvoid *)0x0,0x88ea);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glNamedBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x377);
  GVar1 = local_48;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (*this->m_pClearNamedBufferData)(GVar1,local_44,format,local_34,data);
  dVar4 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
  glu::checkError(dVar4,"glClearNamedBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x2c1);
  (**(code **)(lVar5 + 0x40))(0x8892,local_48);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x37d);
  data_00 = (unsigned_short *)(**(code **)(lVar5 + 0xcf8))(0x8892,35000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glMapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x380);
  bVar7 = (int)local_40 < 1;
  if ((0 < (int)local_40) && (*data_00 == *data)) {
    uVar2 = 1;
    do {
      uVar6 = uVar2;
      if ((local_40 & 0xffffffff) == uVar6) break;
      uVar2 = uVar6 + 1;
    } while (data_00[uVar6] == data[uVar6]);
    bVar7 = (local_40 & 0xffffffff) <= uVar6;
  }
  if (bVar7 == false) {
    LogFail<unsigned_short>(this,false,local_44,data_00,data,(int)local_40);
  }
  (**(code **)(lVar5 + 0x1670))(0x8892);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x38b);
  if (local_48 != 0) {
    (**(code **)(lVar5 + 0x438))(1,&local_48);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x398);
  }
  return bVar7;
}

Assistant:

bool ClearTest::TestClearNamedBufferData(glw::GLenum internalformat, glw::GLsizei count, glw::GLenum format,
										 glw::GLenum type, T* data)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint buffer   = 0;
	bool		is_ok	= true;
	bool		is_error = false;

	try
	{
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferData(buffer, static_cast<glw::GLsizei>(count * sizeof(T)), NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

		ClearNamedBuffer<USE_SUB_DATA>(buffer, internalformat, static_cast<glw::GLsizei>(count * sizeof(T)), format,
									   type, data);

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer failed.");

		T* _data = (T*)gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer failed.");

		is_ok = Compare<T>(_data, data, count);

		if (!is_ok)
		{
			/* Log. */
			LogFail<T>(USE_SUB_DATA, internalformat, _data, data, count);
		}

		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer failed.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		LogError(USE_SUB_DATA, internalformat);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
	}

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}